

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall TPZManVector<int,_1>::Resize(TPZManVector<int,_1> *this,int64_t newsize,int *object)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int64_t i;
  long lVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  if (-1 < newsize) {
    lVar10 = (this->super_TPZVec<int>).fNElements;
    if (lVar10 != newsize) {
      lVar7 = (this->super_TPZVec<int>).fNAlloc;
      if (lVar7 < newsize) {
        if (newsize < 2) {
          if (lVar10 < 1) {
            lVar10 = 0;
          }
          else {
            piVar6 = (this->super_TPZVec<int>).fStore;
            lVar7 = 0;
            do {
              this->fExtAlloc[lVar7] = piVar6[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar10 != lVar7);
          }
          if (lVar10 < newsize) {
            do {
              this->fExtAlloc[lVar10] = *object;
              lVar10 = lVar10 + 1;
            } while (newsize != lVar10);
          }
          piVar6 = (this->super_TPZVec<int>).fStore;
          if (piVar6 != (int *)0x0 && piVar6 != this->fExtAlloc) {
            operator_delete__(piVar6);
          }
          (this->super_TPZVec<int>).fStore = this->fExtAlloc;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = 1;
        }
        else {
          dVar14 = (double)lVar7 * 1.2;
          uVar8 = (long)dVar14;
          if (dVar14 < (double)newsize) {
            uVar8 = newsize;
          }
          piVar6 = (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
          lVar7 = 0;
          if (0 < lVar10) {
            piVar2 = (this->super_TPZVec<int>).fStore;
            lVar9 = 0;
            do {
              piVar6[lVar9] = piVar2[lVar9];
              lVar9 = lVar9 + 1;
              lVar7 = lVar10;
            } while (lVar10 != lVar9);
          }
          auVar5 = _DAT_014f8b30;
          auVar4 = _DAT_014f8350;
          auVar3 = _DAT_014f8340;
          lVar10 = newsize - lVar7;
          if (lVar10 != 0 && lVar7 <= newsize) {
            iVar1 = *object;
            lVar9 = lVar10 + -1;
            auVar12._8_4_ = (int)lVar9;
            auVar12._0_8_ = lVar9;
            auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
            uVar11 = 0;
            auVar12 = auVar12 ^ _DAT_014f8350;
            do {
              auVar15._8_4_ = (int)uVar11;
              auVar15._0_8_ = uVar11;
              auVar15._12_4_ = (int)(uVar11 >> 0x20);
              auVar16 = (auVar15 | auVar3) ^ auVar4;
              iVar13 = auVar12._4_4_;
              if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                          iVar13 < auVar16._4_4_) & 1)) {
                piVar6[lVar7 + uVar11] = iVar1;
              }
              if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
                  auVar16._12_4_ <= auVar12._12_4_) {
                piVar6[lVar7 + uVar11 + 1] = iVar1;
              }
              auVar15 = (auVar15 | auVar5) ^ auVar4;
              iVar17 = auVar15._4_4_;
              if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar15._0_4_ <= auVar12._0_4_)) {
                piVar6[lVar7 + uVar11 + 2] = iVar1;
                piVar6[lVar7 + uVar11 + 3] = iVar1;
              }
              uVar11 = uVar11 + 4;
            } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar11);
          }
          piVar2 = (this->super_TPZVec<int>).fStore;
          if (piVar2 != (int *)0x0 && piVar2 != this->fExtAlloc) {
            operator_delete__(piVar2);
          }
          (this->super_TPZVec<int>).fStore = piVar6;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = uVar8;
        }
      }
      else {
        if (lVar10 < newsize) {
          piVar6 = (this->super_TPZVec<int>).fStore;
          do {
            piVar6[lVar10] = *object;
            lVar10 = lVar10 + 1;
          } while (newsize != lVar10);
        }
        (this->super_TPZVec<int>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}